

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Bound_Function::Bound_Function
          (Bound_Function *this,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  int iVar1;
  element_type *peVar2;
  size_type sVar3;
  bool bVar4;
  int local_6c;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_50;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_38;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_20;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args_local;
  Const_Proxy_Function *t_f_local;
  Bound_Function *this_local;
  
  local_20 = t_args;
  t_args_local = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)t_f;
  t_f_local = (Const_Proxy_Function *)this;
  build_param_type_info(&local_38,t_f,t_args);
  peVar2 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_args_local);
  iVar1 = Proxy_Function_Base::get_arity(peVar2);
  if (-1 < iVar1) {
    build_param_type_info(&local_50,(Const_Proxy_Function *)t_args_local,local_20);
    sVar3 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                      (&local_50);
    local_6c = (int)sVar3 + -1;
  }
  else {
    local_6c = -1;
  }
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_38,local_6c);
  if (-1 < iVar1) {
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_50);
  }
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_38);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Bound_Function_00870c10;
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            (&this->m_f,(shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)t_args_local)
  ;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&this->m_args,local_20);
  peVar2 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_f);
  iVar1 = Proxy_Function_Base::get_arity(peVar2);
  bVar4 = true;
  if (-1 < iVar1) {
    peVar2 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_f);
    iVar1 = Proxy_Function_Base::get_arity(peVar2);
    sVar3 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size
                      (&this->m_args);
    bVar4 = iVar1 == (int)sVar3;
  }
  if (bVar4) {
    return;
  }
  __assert_fail("m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                ,0x1be,
                "chaiscript::dispatch::Bound_Function::Bound_Function(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
               );
}

Assistant:

Bound_Function(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args)
          : Proxy_Function_Base(build_param_type_info(t_f, t_args),
                                (t_f->get_arity() < 0 ? -1 : static_cast<int>(build_param_type_info(t_f, t_args).size()) - 1))
          , m_f(t_f)
          , m_args(t_args) {
        assert(m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size()));
      }